

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mttc0_entryhi_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint32_t tc;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    tc = env->current_tc;
  }
  else {
    tc = (uint32_t)
         ((long)(ulong)(byte)env->CP0_VPEControl % (long)*(int *)((long)env[-4].tcs[0xd].mmr + 0x2c)
         );
  }
  env->CP0_EntryHi = arg1;
  sync_c0_entryhi(env,tc);
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}